

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O2

bool __thiscall HighsLp::equalButForScalingAndNames(HighsLp *this,HighsLp *lp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar3;
  double dVar4;
  ObjSense OVar7;
  ObjSense OVar8;
  __type _Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined4 in_EAX;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  
  uVar1 = this->num_col_;
  uVar5 = this->num_row_;
  uVar2 = lp->num_col_;
  uVar6 = lp->num_row_;
  auVar17._4_4_ = -(uint)(uVar2 == uVar1);
  auVar17._0_4_ = -(uint)(uVar2 == uVar1);
  auVar17._8_4_ = -(uint)(uVar6 == uVar5);
  auVar17._12_4_ = -(uint)(uVar6 == uVar5);
  uVar16 = movmskpd(in_EAX,auVar17);
  OVar7 = lp->sense_;
  OVar8 = this->sense_;
  dVar3 = this->offset_;
  dVar4 = lp->offset_;
  _Var9 = std::operator==(&this->model_name_,&lp->model_name_);
  bVar10 = std::operator==(&this->col_cost_,&lp->col_cost_);
  bVar11 = std::operator==(&this->col_upper_,&lp->col_upper_);
  bVar12 = std::operator==(&this->col_lower_,&lp->col_lower_);
  bVar13 = std::operator==(&this->row_upper_,&lp->row_upper_);
  bVar14 = std::operator==(&this->row_lower_,&lp->row_lower_);
  bVar15 = HighsSparseMatrix::operator==(&this->a_matrix_,&lp->a_matrix_);
  return (bool)(bVar15 & ((((bVar14 && (bVar13 && bVar12)) && ((bVar11 && bVar10) && _Var9)) &&
                          OVar8 == OVar7) && dVar3 == dVar4) & (byte)uVar16 &
                         ((byte)uVar16 & 2) >> 1);
}

Assistant:

bool HighsLp::equalButForScalingAndNames(const HighsLp& lp) const {
  bool equal_vectors = true;
  equal_vectors = this->num_col_ == lp.num_col_ && equal_vectors;
  equal_vectors = this->num_row_ == lp.num_row_ && equal_vectors;
  equal_vectors = this->sense_ == lp.sense_ && equal_vectors;
  equal_vectors = this->offset_ == lp.offset_ && equal_vectors;
  equal_vectors = this->model_name_ == lp.model_name_ && equal_vectors;
  equal_vectors = this->col_cost_ == lp.col_cost_ && equal_vectors;
  equal_vectors = this->col_upper_ == lp.col_upper_ && equal_vectors;
  equal_vectors = this->col_lower_ == lp.col_lower_ && equal_vectors;
  equal_vectors = this->row_upper_ == lp.row_upper_ && equal_vectors;
  equal_vectors = this->row_lower_ == lp.row_lower_ && equal_vectors;
#ifndef NDEBUG
  if (!equal_vectors) printf("HighsLp::equalButForNames: Unequal vectors\n");
#endif
  const bool equal_matrix = this->a_matrix_ == lp.a_matrix_;
#ifndef NDEBUG
  if (!equal_matrix) printf("HighsLp::equalButForNames: Unequal matrix\n");
#endif
  return equal_vectors && equal_matrix;
}